

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsort.c
# Opt level: O1

void sexp_merge_sort(sexp_conflict ctx,sexp_conflict *vec,sexp_conflict *scratch,sexp_sint_t lo,
                    sexp_sint_t hi)

{
  undefined1 auVar1 [16];
  sexp_conflict psVar2;
  sexp_sint_t sVar3;
  sexp_conflict psVar4;
  long hi_00;
  sexp_sint_t sVar5;
  sexp_sint_t sVar6;
  long lVar7;
  long lo_00;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  lVar7 = hi - lo;
  if (lVar7 == 2) {
    sVar5 = sexp_object_compare(ctx,vec[hi],vec[hi + -1],5);
    if (sVar5 < 0) {
      auVar1 = *(undefined1 (*) [16])(vec + hi + -1);
      auVar8._0_8_ = auVar1._8_8_;
      auVar8._8_4_ = auVar1._0_4_;
      auVar8._12_4_ = auVar1._4_4_;
      *(undefined1 (*) [16])(vec + hi + -1) = auVar8;
    }
  }
  else if (lVar7 != 1) {
    if (lVar7 == 0) {
      scratch[lo] = vec[lo];
      return;
    }
    hi_00 = (hi + lo) / 2;
    sexp_merge_sort(ctx,vec,scratch,lo,hi_00);
    lo_00 = hi_00 + 1;
    sexp_merge_sort(ctx,vec,scratch,lo_00,hi);
    if (lo <= hi) {
      sVar5 = lo;
      sVar6 = lo;
      do {
        if (hi_00 < sVar6) {
          psVar4 = vec[lo_00];
          lo_00 = lo_00 + 1;
LAB_00101e69:
          scratch[sVar5] = psVar4;
        }
        else {
          if (hi < lo_00) {
            psVar4 = vec[sVar6];
            sVar6 = sVar6 + 1;
            goto LAB_00101e69;
          }
          sVar3 = sexp_object_compare(ctx,vec[lo_00],vec[sVar6],5);
          if (sVar3 < 0) {
            psVar4 = vec[lo_00];
            lo_00 = lo_00 + 1;
          }
          else {
            psVar4 = vec[sVar6];
            sVar6 = sVar6 + 1;
          }
          scratch[sVar5] = psVar4;
        }
        sVar5 = sVar5 + 1;
      } while (hi + 1 != sVar5);
    }
    memcpy(vec + lo,scratch + lo,lVar7 * 8 + 8);
    return;
  }
  sVar5 = sexp_object_compare(ctx,vec[lo + 1],vec[lo],5);
  if (sVar5 < 0) {
    psVar4 = vec[lo];
    psVar2 = vec[lo + 1];
    vec[lo + 1] = psVar4;
    vec[lo] = psVar2;
    if ((1 < lVar7) && (sVar5 = sexp_object_compare(ctx,vec[lo + 2],psVar4,5), sVar5 < 0)) {
      auVar1 = *(undefined1 (*) [16])(vec + lo + 1);
      auVar9._0_8_ = auVar1._8_8_;
      auVar9._8_4_ = auVar1._0_4_;
      auVar9._12_4_ = auVar1._4_4_;
      *(undefined1 (*) [16])(vec + lo + 1) = auVar9;
    }
  }
  return;
}

Assistant:

static void sexp_merge_sort (sexp ctx, sexp *vec, sexp *scratch, sexp_sint_t lo, sexp_sint_t hi) {
  sexp_sint_t mid, i, j, k;
  sexp tmp;
  switch (hi - lo) {
  case 0:
    scratch[lo] = vec[lo];
    break;
  case 2:
    if (sexp_object_compare(ctx, vec[hi], vec[hi-1], COMPARE_DEPTH) < 0)
      swap(tmp, vec[hi], vec[hi-1]);
    /* ... FALLTHROUGH ... */
  case 1:
    if (sexp_object_compare(ctx, vec[lo+1], vec[lo], COMPARE_DEPTH) < 0) {
      swap(tmp, vec[lo+1], vec[lo]);
      if (hi - lo > 1) {
        if (sexp_object_compare(ctx, vec[lo+2], vec[lo+1], COMPARE_DEPTH) < 0)
          swap(tmp, vec[lo+2], vec[lo+1]);
      }
    }
    break;
  default:                      /* at least 4 elements */
    mid = (hi+lo)/2;
    sexp_merge_sort(ctx, vec, scratch, lo, mid);
    sexp_merge_sort(ctx, vec, scratch, mid+1, hi);
    for (k=lo, i = lo, j = mid+1; k <= hi; ++k) {
      if (i > mid) {
        scratch[k] = vec[j++];
      } else if (j > hi) {
        scratch[k] = vec[i++];
      } else {
        if (sexp_object_compare(ctx, vec[j], vec[i], COMPARE_DEPTH) < 0) {
          scratch[k] = vec[j++];
        } else {
          scratch[k] = vec[i++];
        }
      }
    }
    memcpy(vec + lo, scratch + lo, (hi-lo+1) * sizeof(sexp));
  }
}